

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

long file_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  int iVar1;
  long lVar2;
  FILE *pFVar3;
  ulong uVar4;
  int line;
  uint uVar5;
  char *__modes;
  FILE **out;
  
  pFVar3 = (FILE *)b->ptr;
  uVar4 = 0;
  uVar5 = (uint)num;
  if (cmd < 0x6a) {
    switch(cmd) {
    case 1:
      num = 0;
      goto LAB_002724c5;
    case 2:
      iVar1 = feof(pFVar3);
      goto LAB_002724e8;
    case 3:
switchD_00272465_caseD_3:
      lVar2 = ftell(pFVar3);
      return lVar2;
    case 8:
      uVar4 = (ulong)b->shutdown;
      break;
    case 9:
      b->shutdown = uVar5;
      return 1;
    case 0xb:
      iVar1 = fflush(pFVar3);
      uVar4 = (ulong)(iVar1 == 0);
    }
  }
  else {
    if (cmd < 0x6c) {
      if (cmd != 0x6a) {
        if (cmd != 0x6b) {
          return 0;
        }
        if (ptr != (void *)0x0) {
          *(FILE **)ptr = pFVar3;
          return 1;
        }
        return 1;
      }
      file_free(b);
      b->shutdown = uVar5 & 1;
      b->ptr = ptr;
LAB_0027258f:
      b->init = 1;
      return 1;
    }
    if (cmd == 0x6c) {
      file_free(b);
      b->shutdown = uVar5 & 1;
      if ((num & 8U) == 0) {
        if ((uVar5 & 6) == 6) {
          __modes = "rb+";
        }
        else {
          __modes = "wb";
          if ((num & 4U) == 0) {
            __modes = "rb";
          }
          if ((num & 6U) == 0) {
            iVar1 = 100;
            line = 0xbb;
            goto LAB_00272624;
          }
        }
      }
      else {
        __modes = "ab+";
        if ((num & 2U) == 0) {
          __modes = "ab";
        }
      }
      pFVar3 = fopen64((char *)ptr,__modes);
      if (pFVar3 == (FILE *)0x0) {
        ERR_put_error(2,0,0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                      ,0xc0);
        ERR_add_error_data(5,"fopen(\'",ptr,"\',\'",__modes,"\')");
        iVar1 = 2;
        line = 0xc2;
LAB_00272624:
        ERR_put_error(0x11,0,iVar1,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/file.cc"
                      ,line);
        return 0;
      }
      b->ptr = pFVar3;
      goto LAB_0027258f;
    }
    if (cmd != 0x80) {
      if (cmd != 0x85) {
        return 0;
      }
      goto switchD_00272465_caseD_3;
    }
LAB_002724c5:
    iVar1 = fseek(pFVar3,num,0);
LAB_002724e8:
    uVar4 = (ulong)iVar1;
  }
  return uVar4;
}

Assistant:

static long file_ctrl(BIO *b, int cmd, long num, void *ptr) {
  FILE *fp = static_cast<FILE *>(b->ptr);
  switch (cmd) {
    case BIO_CTRL_RESET:
      num = 0;
      [[fallthrough]];
    case BIO_C_FILE_SEEK:
      return fseek(fp, num, 0);
    case BIO_CTRL_EOF:
      return feof(fp);
    case BIO_C_FILE_TELL:
    case BIO_CTRL_INFO:
      return ftell(fp);
    case BIO_C_SET_FILE_PTR:
      file_free(b);
      static_assert((BIO_CLOSE & BIO_FP_TEXT) == 0,
                    "BIO_CLOSE and BIO_FP_TEXT must not collide");
#if defined(OPENSSL_WINDOWS)
      // If |BIO_FP_TEXT| is not set, OpenSSL will switch the file to binary
      // mode. BoringSSL intentionally diverges here because it means code
      // tested under POSIX will inadvertently change the state of |FILE|
      // objects when wrapping them in a |BIO|.
      if (num & BIO_FP_TEXT) {
        _setmode(_fileno(reinterpret_cast<FILE *>(ptr)), _O_TEXT);
      }
#endif
      b->shutdown = static_cast<int>(num) & BIO_CLOSE;
      b->ptr = ptr;
      b->init = 1;
      return 1;
    case BIO_C_SET_FILENAME:
      file_free(b);
      b->shutdown = static_cast<int>(num) & BIO_CLOSE;
      const char *mode;
      if (num & BIO_FP_APPEND) {
        if (num & BIO_FP_READ) {
          mode = "ab+";
        } else {
          mode = "ab";
        }
      } else if ((num & BIO_FP_READ) && (num & BIO_FP_WRITE)) {
        mode = "rb+";
      } else if (num & BIO_FP_WRITE) {
        mode = "wb";
      } else if (num & BIO_FP_READ) {
        mode = "rb";
      } else {
        OPENSSL_PUT_ERROR(BIO, BIO_R_BAD_FOPEN_MODE);
        return 0;
      }
      fp = fopen_if_available(reinterpret_cast<const char *>(ptr), mode);
      if (fp == nullptr) {
        OPENSSL_PUT_SYSTEM_ERROR();
        ERR_add_error_data(5, "fopen('", ptr, "','", mode, "')");
        OPENSSL_PUT_ERROR(BIO, ERR_R_SYS_LIB);
        return 0;
      }
      b->ptr = fp;
      b->init = 1;
      return 1;
    case BIO_C_GET_FILE_PTR:
      // the ptr parameter is actually a FILE ** in this case.
      if (ptr != nullptr) {
        FILE **out = static_cast<FILE **>(ptr);
        *out = fp;
      }
      return 1;
    case BIO_CTRL_GET_CLOSE:
      return b->shutdown;
    case BIO_CTRL_SET_CLOSE:
      b->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_FLUSH:
      return fflush(fp) == 0;
    default:
      return 0;
  }
}